

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

void Abc_NtkFinalize(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  Abc_Obj_t *pAVar1;
  char *pcVar2;
  undefined8 *puVar3;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < pNtk->vCos->nSize; i_00 = i_00 + 1) {
    pAVar1 = Abc_NtkCo(pNtk,i_00);
    puVar3 = (undefined8 *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
    if (*(int *)*puVar3 == 1) {
      puVar3 = *(undefined8 **)
                (*(long *)(*(long *)((int *)*puVar3 + 8) + 8) + (long)*(int *)puVar3[4] * 8);
    }
    Abc_ObjAddFanin((pAVar1->field_6).pCopy,
                    (Abc_Obj_t *)((ulong)(*(uint *)&pAVar1->field_0x14 >> 10 & 1) ^ puVar3[8]));
  }
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    Abc_NtkTimeInitialize(pNtkNew,pNtk);
  }
  if (pNtk->vPhases != (Vec_Int_t *)0x0) {
    Abc_NtkTransferPhases(pNtkNew,pNtk);
  }
  if (pNtk->pWLoadUsed != (char *)0x0) {
    pcVar2 = Abc_UtilStrsav(pNtk->pWLoadUsed);
    pNtkNew->pWLoadUsed = pcVar2;
  }
  return;
}

Assistant:

void Abc_NtkFinalize( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj, * pDriver, * pDriverNew;
    int i;
    // set the COs of the strashed network
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pDriver    = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pObj) );
        pDriverNew = Abc_ObjNotCond(pDriver->pCopy, Abc_ObjFaninC0(pObj));
        Abc_ObjAddFanin( pObj->pCopy, pDriverNew );
    }
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
}